

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestEnd
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  TestResult *this_00;
  bool bVar1;
  char *fmt;
  GTestColor color;
  TimeInMillis local_38;
  string local_30;
  
  this_00 = &test_info->result_;
  bVar1 = TestResult::Skipped(this_00);
  if (bVar1) {
LAB_0011c99b:
    bVar1 = TestResult::Skipped(this_00);
    if (!bVar1) {
      fmt = "[  FAILED  ] ";
      color = kRed;
      goto LAB_0011c9ca;
    }
    fmt = "[  SKIPPED ] ";
  }
  else {
    bVar1 = TestResult::Failed(this_00);
    if (bVar1) goto LAB_0011c99b;
    fmt = "[       OK ] ";
  }
  color = kGreen;
LAB_0011c9ca:
  ColoredPrintf(color,fmt);
  printf("%s.%s",(test_info->test_suite_name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p)
  ;
  bVar1 = TestResult::Failed(this_00);
  if (bVar1) {
    PrintFullTestCommentIfPresent(test_info);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_38 = (test_info->result_).elapsed_time_;
    StreamableToString<long>(&local_30,&local_38);
    printf(" (%s ms)\n",local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    putchar(10);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Passed()) {
    ColoredPrintf(GTestColor::kGreen, "[       OK ] ");
  } else if (test_info.result()->Skipped()) {
    ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
  } else {
    ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
  }
  PrintTestName(test_info.test_suite_name(), test_info.name());
  if (test_info.result()->Failed()) PrintFullTestCommentIfPresent(test_info);

  if (GTEST_FLAG_GET(print_time)) {
    printf(" (%s ms)\n",
           internal::StreamableToString(test_info.result()->elapsed_time())
               .c_str());
  } else {
    printf("\n");
  }
  fflush(stdout);
}